

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_insert(lua_State *L,int idx)

{
  TValue *pTVar1;
  TValue *p;
  TValue *q;
  int idx_local;
  lua_State *L_local;
  
  pTVar1 = index2adr_stack(L,idx);
  for (p = L->top; pTVar1 < p; p = p + -1) {
    *p = p[-1];
  }
  *pTVar1 = *L->top;
  return;
}

Assistant:

LUA_API void lua_insert(lua_State *L, int idx)
{
  TValue *q, *p = index2adr_stack(L, idx);
  for (q = L->top; q > p; q--) copyTV(L, q, q-1);
  copyTV(L, p, L->top);
}